

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_free_kv_var_test(void)

{
  char *__format;
  void *key;
  int v;
  timeval __test_begin;
  undefined2 *local_f8;
  undefined4 local_ec;
  timeval local_e8;
  btree local_d8;
  btree_kv_ops local_98;
  
  gettimeofday(&local_e8,(__timezone_ptr_t)0x0);
  memleak_start();
  btree_str_kv_get_kb64_vb64(&local_98);
  local_d8.vsize = '\x04';
  local_ec = 1;
  local_f8 = (undefined2 *)malloc(0xd);
  *local_f8 = 0xb00;
  *(undefined8 *)(local_f8 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)local_f8 + 9) = 0x676e69;
  (*local_98.free_kv_var)(&local_d8,&local_f8,&local_ec);
  if (local_f8 != (undefined2 *)0x0) {
    kv_free_kv_var_test();
  }
  (*local_98.free_kv_var)(&local_d8,&local_f8,&local_ec);
  if (local_f8 != (undefined2 *)0x0) {
    kv_free_kv_var_test();
  }
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_free_kv_var_test()::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv_free_kv_var_test");
  return;
}

Assistant:

void kv_free_kv_var_test()
{
    TEST_INIT();
    memleak_start();

    btree_kv_ops *kv_ops;
    btree *tree;
    void *key;
    int v;
    char str[] = "teststring";

    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    tree = alca(struct btree, 1);
    tree->vsize = sizeof(v);
    v = 1;
    construct_key_ptr(str, sizeof(str), &key);

    // free kv string
    kv_ops->free_kv_var(tree, &key, (void *)&v);
    TEST_CHK(key == NULL);

    // attempt double free
    kv_ops->free_kv_var(tree, &key, (void *)&v);
    TEST_CHK(key == NULL);

    memleak_end();
    TEST_RESULT("kv_free_kv_var_test");
}